

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SaveIniSettingsToDisk(char *ini_filename)

{
  char *__ptr;
  FILE *__s;
  FILE *f;
  char *ini_data;
  size_t ini_data_size;
  ImGuiContext *g;
  char *ini_filename_local;
  
  ini_data_size = (size_t)GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    ini_data = (char *)0x0;
    g = (ImGuiContext *)ini_filename;
    __ptr = SaveIniSettingsToMemory((size_t *)&ini_data);
    __s = (FILE *)ImFileOpen(&g->Initialized,"wt");
    if (__s != (FILE *)0x0) {
      fwrite(__ptr,1,(size_t)ini_data,__s);
      fclose(__s);
    }
  }
  return;
}

Assistant:

void ImGui::SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    size_t ini_data_size = 0;
    const char* ini_data = SaveIniSettingsToMemory(&ini_data_size);
    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(ini_data, sizeof(char), ini_data_size, f);
    fclose(f);
}